

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O2

Error asmjit::VirtMem::releaseDualMapping(DualMapping *dm,size_t size)

{
  Error EVar1;
  Error EVar2;
  
  EVar1 = release(dm->ro,size);
  if (dm->ro != dm->rw) {
    EVar2 = release(dm->rw,size);
    EVar1 = EVar1 | EVar2;
  }
  if (EVar1 == 0) {
    dm->ro = (void *)0x0;
    dm->rw = (void *)0x0;
    EVar1 = 0;
  }
  else {
    EVar1 = 2;
  }
  return EVar1;
}

Assistant:

Error VirtMem::releaseDualMapping(DualMapping* dm, size_t size) noexcept {
  Error err = release(dm->ro, size);
  if (dm->ro != dm->rw)
    err |= release(dm->rw, size);

  if (err)
    return DebugUtils::errored(kErrorInvalidArgument);

  dm->ro = nullptr;
  dm->rw = nullptr;
  return kErrorOk;
}